

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_cell_below_quality
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_DBL min_quality,REF_GLOB *nnode_global,
          REF_LONG *ncell_global,REF_GLOB **l2c)

{
  size_t __size;
  int iVar1;
  int iVar2;
  REF_STATUS RVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  REF_LONG RVar7;
  undefined8 uVar8;
  REF_GLOB *pRVar9;
  long lVar10;
  long lVar11;
  long *in_R9;
  char *pcVar12;
  int iVar13;
  REF_INT nnode;
  REF_INT part;
  REF_DBL quality;
  REF_INT nodes [27];
  int local_dc;
  uint local_d8;
  int local_d4;
  REF_GLOB **local_d0;
  REF_GRID local_c8;
  REF_LONG *local_c0;
  REF_DBL local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  iVar13 = ref_cell->last_node_is_an_id;
  local_b8 = min_quality;
  if ((long)iVar13 < 0) {
    pcVar12 = "malloc *l2c of REF_GLOB negative";
    uVar8 = 0x51;
LAB_00143561:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar8,
           "ref_gather_cell_below_quality",pcVar12);
    uVar4 = 1;
  }
  else {
    __size = (long)iVar13 * 8;
    local_d0 = l2c;
    pvVar5 = malloc(__size);
    *in_R9 = (long)pvVar5;
    if (pvVar5 == (void *)0x0) {
      pcVar12 = "malloc *l2c of REF_GLOB NULL";
      uVar8 = 0x51;
LAB_00143594:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar8,"ref_gather_cell_below_quality",pcVar12);
      return 2;
    }
    if (iVar13 != 0) {
      memset(pvVar5,0xff,__size);
    }
    pRVar9 = (REF_GLOB *)0x0;
    *ncell_global = 0;
    *local_d0 = (REF_GLOB *)0x0;
    local_d8 = 0;
    if (0 < *(int *)((long)nnode_global + 0x2c)) {
      iVar13 = 0;
      local_dc = 0;
      local_c8 = ref_grid;
      local_c0 = ncell_global;
      do {
        RVar3 = ref_cell_nodes((REF_CELL)nnode_global,iVar13,local_a8);
        if (RVar3 == 0) {
          uVar4 = ref_cell_part((REF_CELL)nnode_global,(REF_NODE)ref_cell,iVar13,&local_d4);
          if (uVar4 != 0) {
            pcVar12 = "part";
            uVar8 = 0x59;
            goto LAB_0014375d;
          }
          if (*(int *)((long)&local_c8->mpi + 4) == local_d4) {
            uVar4 = ref_node_tet_quality((REF_NODE)ref_cell,local_a8,&local_b0);
            if (uVar4 != 0) {
              pcVar12 = "qual";
              uVar8 = 0x5b;
              goto LAB_0014375d;
            }
            if (local_b0 < local_b8) {
              local_dc = local_dc + 1;
              iVar1 = *(int *)((long)nnode_global + 0xc);
              if (0 < (long)iVar1) {
                lVar6 = *(long *)&ref_cell->n;
                iVar2 = *(int *)(*(long *)&ref_cell[1].size_per + 4);
                lVar10 = 0;
                do {
                  lVar11 = (long)local_a8[lVar10];
                  if ((iVar2 == *(int *)(lVar6 + lVar11 * 4)) &&
                     (*(long *)(*in_R9 + lVar11 * 8) == -1)) {
                    *(long *)(*in_R9 + lVar11 * 8) = (long)(int)pRVar9;
                    local_d8 = (int)pRVar9 + 1;
                    pRVar9 = (REF_GLOB *)(ulong)local_d8;
                  }
                  lVar10 = lVar10 + 1;
                } while (iVar1 != lVar10);
              }
            }
          }
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < *(int *)((long)nnode_global + 0x2c));
      pRVar9 = (REF_GLOB *)(long)local_dc;
      ref_grid = local_c8;
      ncell_global = local_c0;
    }
    *local_d0 = pRVar9;
    uVar4 = ref_mpi_allsum((REF_MPI)ref_grid,local_d0,1,2);
    if (uVar4 == 0) {
      if ((long)*(int *)&ref_grid->mpi < 0) {
        pcVar12 = "malloc counts of REF_INT negative";
        uVar8 = 0x6c;
        goto LAB_00143561;
      }
      pvVar5 = malloc((long)*(int *)&ref_grid->mpi << 2);
      if (pvVar5 == (void *)0x0) {
        pcVar12 = "malloc counts of REF_INT NULL";
        uVar8 = 0x6c;
        goto LAB_00143594;
      }
      uVar4 = ref_mpi_allgather((REF_MPI)ref_grid,&local_d8,pvVar5,1);
      if (uVar4 == 0) {
        lVar6 = (long)*(int *)((long)&ref_grid->mpi + 4);
        if (lVar6 < 1) {
          lVar10 = 0;
        }
        else {
          lVar11 = 0;
          lVar10 = 0;
          do {
            lVar10 = lVar10 + *(int *)((long)pvVar5 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (lVar6 != lVar11);
        }
        if (0 < (long)*(int *)&ref_grid->mpi) {
          RVar7 = *ncell_global;
          lVar6 = 0;
          do {
            RVar7 = RVar7 + *(int *)((long)pvVar5 + lVar6 * 4);
            lVar6 = lVar6 + 1;
          } while (*(int *)&ref_grid->mpi != lVar6);
          *ncell_global = RVar7;
        }
        free(pvVar5);
        iVar13 = ref_cell->last_node_is_an_id;
        pRVar9 = (REF_GLOB *)*in_R9;
        if (0 < (long)iVar13) {
          lVar6 = 0;
          do {
            if (pRVar9[lVar6] != -1) {
              pRVar9[lVar6] = pRVar9[lVar6] + lVar10;
            }
            lVar6 = lVar6 + 1;
          } while (iVar13 != lVar6);
        }
        uVar4 = ref_node_ghost_glob((REF_NODE)ref_cell,pRVar9,1);
        if (uVar4 == 0) {
          return 0;
        }
        pcVar12 = "xfer";
        uVar8 = 0x7b;
      }
      else {
        pcVar12 = "gather size";
        uVar8 = 0x6d;
      }
    }
    else {
      pcVar12 = "allsum";
      uVar8 = 0x6a;
    }
LAB_0014375d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar8,
           "ref_gather_cell_below_quality",(ulong)uVar4,pcVar12);
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_below_quality(
    REF_GRID ref_grid, REF_CELL ref_cell, REF_DBL min_quality,
    REF_GLOB *nnode_global, REF_LONG *ncell_global, REF_GLOB **l2c) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, part, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_GLOB offset;
  REF_DBL quality;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
      if (quality < min_quality) {
        ncell++;
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          if (ref_node_owned(ref_node, nodes[node]) &&
              (REF_EMPTY == (*l2c)[nodes[node]])) {
            (*l2c)[nodes[node]] = nnode;
            nnode++;
          }
        }
      }
    }
  }

  (*ncell_global) = ncell;
  RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += counts[proc];
  }
  each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }